

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

Test * GraphTestDyndepFileMissing::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x230);
  GraphTestDyndepFileMissing((GraphTestDyndepFileMissing *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(GraphTest, DyndepFileMissing) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out: r || dd\n"
"  dyndep = dd\n"
  );

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("out"), NULL, &err));
  ASSERT_EQ("loading 'dd': No such file or directory", err);
}